

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_unres_data_item(lyd_node *node,UNRES_ITEM type,int ignore_fail,lys_when **failed_when)

{
  lys_node *plVar1;
  int iVar2;
  lys_type *plVar3;
  lys_node_leaf *sleaf;
  lyd_node *ret;
  lyd_node_leaf_list *leaf;
  int local_30;
  int ext_dep;
  int req_inst;
  int rc;
  lys_when **failed_when_local;
  int ignore_fail_local;
  UNRES_ITEM type_local;
  lyd_node *node_local;
  
  plVar1 = node->schema;
  ret = node;
  _req_inst = failed_when;
  failed_when_local._0_4_ = ignore_fail;
  failed_when_local._4_4_ = type;
  _ignore_fail_local = node;
  if (type == UNRES_LEAFREF) {
    if (*(int *)&plVar1[1].ref != 9) {
      __assert_fail("sleaf->type.base == LY_TYPE_LEAFREF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                    ,0x1fe2,
                    "int resolve_unres_data_item(struct lyd_node *, enum UNRES_ITEM, int, struct lys_when **)"
                   );
    }
    if ((node->validity & 8) == 0) {
      __assert_fail("leaf->validity & LYD_VAL_LEAFREF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                    ,0x1fe3,
                    "int resolve_unres_data_item(struct lyd_node *, enum UNRES_ITEM, int, struct lys_when **)"
                   );
    }
    if (ignore_fail == 0) {
      local_30 = (int)*(char *)&plVar1[1].parent;
    }
    else {
      local_30 = -1;
    }
    if (((node->schema->flags & 0x800) == 0) || (ignore_fail != 2)) {
      ext_dep = resolve_leafref((lyd_node_leaf_list *)node,(char *)plVar1[1].module,local_30,
                                (lyd_node **)&sleaf);
    }
    else {
      ext_dep = 0;
      sleaf = (lys_node_leaf *)0x0;
    }
    if (ext_dep != 0) {
      return ext_dep;
    }
    if ((sleaf == (lys_node_leaf *)0x0) || ((ret->schema->flags & 0x800) != 0)) {
      if ((((ulong)ret[1].schema & 0x100000000) == 0) &&
         (plVar3 = lyp_parse_value((lys_type *)&plVar1[1].ref,(char **)&ret->ht,(lyxml_elem *)0x0,
                                   (lyd_node_leaf_list *)ret,(lyd_attr *)0x0,(lys_module *)0x0,1,0,0
                                  ), plVar3 == (lys_type *)0x0)) {
        return -1;
      }
    }
    else {
      if (*(int *)&ret[1].schema == 2) {
        free(ret->child);
      }
      ret->child = (lyd_node *)sleaf;
      *(undefined4 *)&ret[1].schema = 9;
      *(byte *)((long)&ret[1].schema + 4) = *(byte *)((long)&ret[1].schema + 4) & 0xfe;
    }
    ret->validity = ret->validity & 0xf7;
  }
  else if (type == UNRES_INSTID) {
    if (*(int *)&plVar1[1].ref != 8) {
      __assert_fail("sleaf->type.base == LY_TYPE_INST",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                    ,0x2008,
                    "int resolve_unres_data_item(struct lyd_node *, enum UNRES_ITEM, int, struct lys_when **)"
                   );
    }
    leaf._4_4_ = check_instid_ext_dep(node->schema,(char *)node->ht);
    if (leaf._4_4_ == -1) {
      return -1;
    }
    if ((int)failed_when_local == 0) {
      local_30 = (int)*(char *)&plVar1[1].module;
    }
    else {
      local_30 = -1;
    }
    if ((leaf._4_4_ == 0) || ((int)failed_when_local != 2)) {
      ext_dep = resolve_instid(_ignore_fail_local,(char *)ret->ht,local_30,(lyd_node **)&sleaf);
    }
    else {
      ext_dep = 0;
      sleaf = (lys_node_leaf *)0x0;
    }
    if (ext_dep != 0) {
      return ext_dep;
    }
    if ((sleaf == (lys_node_leaf *)0x0) || (leaf._4_4_ != 0)) {
      ret->child = (lyd_node *)0x0;
      *(undefined4 *)&ret[1].schema = 8;
      *(byte *)((long)&ret[1].schema + 4) = *(byte *)((long)&ret[1].schema + 4) | 1;
    }
    else {
      ret->child = (lyd_node *)sleaf;
      *(undefined4 *)&ret[1].schema = 8;
      *(byte *)((long)&ret[1].schema + 4) = *(byte *)((long)&ret[1].schema + 4) & 0xfe;
    }
  }
  else {
    if (type == UNRES_WHEN) {
      iVar2 = resolve_when(node,ignore_fail,failed_when);
    }
    else if (type == UNRES_MUST) {
      iVar2 = resolve_must(node,0,ignore_fail);
    }
    else {
      if (type != UNRES_MUST_INOUT) {
        if (type == UNRES_UNION) {
          if (*(int *)&plVar1[1].ref != 0xb) {
            __assert_fail("sleaf->type.base == LY_TYPE_UNION",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                          ,0x202c,
                          "int resolve_unres_data_item(struct lyd_node *, enum UNRES_ITEM, int, struct lys_when **)"
                         );
          }
          iVar2 = resolve_union((lyd_node_leaf_list *)node,(lys_type *)&plVar1[1].ref,1,ignore_fail,
                                (lys_type **)0x0);
          return iVar2;
        }
        if (type == UNRES_UNIQ_LEAVES) {
          iVar2 = lyv_data_unique(node);
          if (iVar2 == 0) {
            return 0;
          }
          return -1;
        }
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
               ,0x2048);
        return -1;
      }
      iVar2 = resolve_must(node,1,ignore_fail);
    }
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  return 0;
}

Assistant:

int
resolve_unres_data_item(struct lyd_node *node, enum UNRES_ITEM type, int ignore_fail, struct lys_when **failed_when)
{
    int rc, req_inst, ext_dep;
    struct lyd_node_leaf_list *leaf;
    struct lyd_node *ret;
    struct lys_node_leaf *sleaf;

    leaf = (struct lyd_node_leaf_list *)node;
    sleaf = (struct lys_node_leaf *)leaf->schema;

    switch (type) {
    case UNRES_LEAFREF:
        assert(sleaf->type.base == LY_TYPE_LEAFREF);
        assert(leaf->validity & LYD_VAL_LEAFREF);
        if (ignore_fail) {
            req_inst = -1;
        } else {
            req_inst = sleaf->type.info.lref.req;
        }
        if ((leaf->schema->flags & LYS_LEAFREF_DEP) && (ignore_fail == 2)) {
            /* do not even try to resolve */
            rc = 0;
            ret = NULL;
        } else {
            rc = resolve_leafref(leaf, sleaf->type.info.lref.path, req_inst, &ret);
        }
        if (!rc) {
            if (ret && !(leaf->schema->flags & LYS_LEAFREF_DEP)) {
                /* valid resolved */
                if (leaf->value_type == LY_TYPE_BITS) {
                    free(leaf->value.bit);
                }
                leaf->value.leafref = ret;
                leaf->value_type = LY_TYPE_LEAFREF;
                leaf->value_flags &= ~LY_VALUE_UNRES;
            } else {
                /* valid unresolved */
                if (!(leaf->value_flags & LY_VALUE_UNRES)) {
                    if (!lyp_parse_value(&sleaf->type, &leaf->value_str, NULL, leaf, NULL, NULL, 1, 0, 0)) {
                        return -1;
                    }
                }
            }
            leaf->validity &= ~LYD_VAL_LEAFREF;
        } else {
            return rc;
        }
        break;

    case UNRES_INSTID:
        assert(sleaf->type.base == LY_TYPE_INST);
        ext_dep = check_instid_ext_dep(leaf->schema, leaf->value_str);
        if (ext_dep == -1) {
            return -1;
        }

        if (ignore_fail) {
            req_inst = -1;
        } else {
            req_inst = sleaf->type.info.inst.req;
        }
        if (ext_dep && (ignore_fail == 2)) {
            /* do not even try to resolve */
            rc = 0;
            ret = NULL;
        } else {
            rc = resolve_instid(node, leaf->value_str, req_inst, &ret);
        }
        if (!rc) {
            if (ret && !ext_dep) {
                /* valid resolved */
                leaf->value.instance = ret;
                leaf->value_type = LY_TYPE_INST;
                leaf->value_flags &= ~LY_VALUE_UNRES;
            } else {
                /* valid unresolved */
                leaf->value.instance = NULL;
                leaf->value_type = LY_TYPE_INST;
                leaf->value_flags |= LY_VALUE_UNRES;
            }
        } else {
            return rc;
        }
        break;

    case UNRES_UNION:
        assert(sleaf->type.base == LY_TYPE_UNION);
        return resolve_union(leaf, &sleaf->type, 1, ignore_fail, NULL);

    case UNRES_WHEN:
        if ((rc = resolve_when(node, ignore_fail, failed_when))) {
            return rc;
        }
        break;

    case UNRES_MUST:
        if ((rc = resolve_must(node, 0, ignore_fail))) {
            return rc;
        }
        break;

    case UNRES_MUST_INOUT:
        if ((rc = resolve_must(node, 1, ignore_fail))) {
            return rc;
        }
        break;

    case UNRES_UNIQ_LEAVES:
        if (lyv_data_unique(node)) {
            return -1;
        }
        break;

    default:
        LOGINT(NULL);
        return -1;
    }

    return EXIT_SUCCESS;
}